

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O2

void __thiscall
nuraft::raft_server::handle_custom_notification_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  int iVar2;
  iterator iVar3;
  ptr<peer> p;
  
  if (resp->accepted_ == true) {
    p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         (resp->super_msg_base).src_;
    iVar3 = std::
            _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->peers_)._M_h,(key_type_conflict *)&p);
    if (iVar3.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar2 = (*peVar1->_vptr_logger[7])();
        if (3 < iVar2) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&p,"the response is from an unknown peer %d",
                     (ulong)(uint)(resp->super_msg_base).src_);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                     ,"handle_custom_notification_resp",0xfe,(string *)&p);
          std::__cxx11::string::~string((string *)&p);
        }
      }
    }
    else {
      std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                        ._M_cur + 0x10));
      LOCK();
      *(ulong *)(CONCAT44(p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                          _4_4_,(int32)p.
                                       super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr) + 0x68) = resp->next_idx_;
      UNLOCK();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return;
}

Assistant:

void raft_server::handle_custom_notification_resp(resp_msg& resp) {
    if (!resp.get_accepted()) return;

    peer_itor it = peers_.find(resp.get_src());
    if (it == peers_.end()) {
        p_in("the response is from an unknown peer %d", resp.get_src());
        return;
    }
    ptr<peer> p = it->second;

    p->set_next_log_idx(resp.get_next_idx());
}